

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdCelsiusLightV::emulate_mthd(MthdCelsiusLightV *this)

{
  uint32_t uVar1;
  int local_18;
  uint32_t local_14;
  int i;
  uint32_t err;
  MthdCelsiusLightV *this_local;
  
  local_14 = 0;
  if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c
            << 0x37) < 0) {
    local_14 = 4;
  }
  if (local_14 == 0) {
    if ((-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource
                    << 0x3e)) &&
       ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk
        [*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914] =
             (this->super_SingleMthdTest).super_MthdTest.val,
       *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 == 2)) {
      for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
        uVar1 = pgraph_celsius_convert_light_v
                          ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                           celsius_pipe_junk[local_18]);
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_light_v
        [this->which][local_18] = uVar1;
      }
    }
  }
  else {
    MthdTest::warn((MthdTest *)this,local_14);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				exp.celsius_pipe_junk[idx] = val;
				if (idx == 2) {
					for (int i = 0; i < 3; i++)
						exp.celsius_pipe_light_v[which][i] = pgraph_celsius_convert_light_v(exp.celsius_pipe_junk[i]);
				}
			}
		}
	}